

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O1

int tidyRunDiagnostics(TidyDoc tdoc)

{
  uint uVar1;
  TidyDocImpl *impl;
  
  if (tdoc != (TidyDoc)0x0) {
    prvTidyReportMarkupVersion((TidyDocImpl *)tdoc);
    prvTidyReportNumWarnings((TidyDocImpl *)tdoc);
    if ((tdoc[0xd11]._opaque != 0) && (tdoc[0x5a]._opaque == 0)) {
      prvTidyDialogue((TidyDocImpl *)tdoc,0x21c);
    }
    uVar1 = 2;
    if ((tdoc[0xd11]._opaque == 0) && (uVar1 = 1, tdoc[0xd12]._opaque == 0)) {
      uVar1 = (uint)(tdoc[0xd13]._opaque != 0);
    }
    return uVar1;
  }
  return -0x16;
}

Assistant:

int TIDY_CALL        tidyRunDiagnostics( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocRunDiagnostics( impl );
    return -EINVAL;
}